

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildDescription.cpp
# Opt level: O1

Command * __thiscall
llbuild::buildsystem::BuildDescription::addCommand
          (BuildDescription *this,
          unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>
          *value)

{
  Command *pCVar1;
  long lVar2;
  Command *pCVar3;
  long *plVar4;
  StringRef Key;
  pair<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>_>,_bool>
  pVar5;
  
  pCVar1 = (value->_M_t).
           super___uniq_ptr_impl<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>
           ._M_t.
           super__Tuple_impl<0UL,_llbuild::buildsystem::Command_*,_std::default_delete<llbuild::buildsystem::Command>_>
           .super__Head_base<0UL,_llbuild::buildsystem::Command_*,_false>._M_head_impl;
  Key.Data = (pCVar1->name)._M_dataplus._M_p;
  Key.Length = (pCVar1->name)._M_string_length;
  pVar5 = llvm::
          StringMap<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>,_llvm::MallocAllocator>
          ::try_emplace<>(&this->commands,Key);
  lVar2 = *(long *)pVar5.first.
                   super_StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>_>,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>_>_>
                   .Ptr.
                   super_StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>_>,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>_>_>
  ;
  pCVar3 = (value->_M_t).
           super___uniq_ptr_impl<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>
           ._M_t.
           super__Tuple_impl<0UL,_llbuild::buildsystem::Command_*,_std::default_delete<llbuild::buildsystem::Command>_>
           .super__Head_base<0UL,_llbuild::buildsystem::Command_*,_false>._M_head_impl;
  (value->_M_t).
  super___uniq_ptr_impl<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>
  ._M_t.
  super__Tuple_impl<0UL,_llbuild::buildsystem::Command_*,_std::default_delete<llbuild::buildsystem::Command>_>
  .super__Head_base<0UL,_llbuild::buildsystem::Command_*,_false>._M_head_impl = (Command *)0x0;
  plVar4 = *(long **)(lVar2 + 8);
  *(Command **)(lVar2 + 8) = pCVar3;
  if (plVar4 != (long *)0x0) {
    (**(code **)(*plVar4 + 8))();
  }
  return pCVar1;
}

Assistant:

Command& BuildDescription::addCommand(std::unique_ptr<Command> value) {
  auto& result = *value.get();
  getCommands()[value->getName()] = std::move(value);
  return result;
}